

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repair_Response_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Repair_Response_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Repair_Response_PDU *this)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong uVar3;
  KINT32 Value;
  ushort uVar4;
  KStringStream ss;
  char local_3a1;
  KString local_3a0;
  long *local_380;
  long local_378;
  long local_370 [2];
  KString local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-Repair Response PDU-\n",0x16);
  Logistics_Header::GetAsString_abi_cxx11_(&local_3a0,&this->super_Logistics_Header);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  local_3a1 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_3a1,1);
  if (local_3a0._M_string_length != 0) {
    uVar4 = 1;
    uVar3 = 0;
    do {
      local_3a1 = local_3a0._M_dataplus._M_p[uVar3];
      if ((local_3a0._M_string_length - 1 == uVar3) || (local_3a1 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_3a1,1);
      }
      else {
        local_3a1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_3a1,1);
        local_3a1 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_3a1,1);
      }
      uVar3 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar3 < local_3a0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tRepair Result:         ",0x18);
  DATA_TYPE::ENUMS::GetEnumAsStringRepairResult_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui8RepairResult,Value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((ostream *)local_340._0_8_ != poVar1) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString Repair_Response_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Repair Response PDU-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 )
       << "\tRepair Result:         " << GetEnumAsStringRepairResult( m_ui8RepairResult )
       << "\n";

    return ss.str();
}